

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_filter_intra_edge_c(uint8_t *p,int sz,int strength)

{
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int k;
  int j;
  int s;
  int i;
  uint8_t edge [129];
  int filt;
  int kernel [3] [5];
  int local_100;
  int local_fc;
  int local_f4;
  int local_f0;
  int local_ec;
  byte local_e8 [140];
  int local_5c;
  int local_58 [18];
  int local_10;
  int local_c;
  void *local_8;
  
  if (in_EDX != 0) {
    local_10 = in_EDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    memcpy(local_58,&DAT_00c133e0,0x3c);
    local_5c = local_10 + -1;
    memcpy(local_e8,local_8,(long)local_c);
    for (local_ec = 1; local_ec < local_c; local_ec = local_ec + 1) {
      local_f0 = 0;
      for (local_f4 = 0; local_f4 < 5; local_f4 = local_f4 + 1) {
        local_fc = local_ec + -2 + local_f4;
        if (local_fc < 0) {
          local_fc = 0;
        }
        if (local_c + -1 < local_fc) {
          local_100 = local_c + -1;
        }
        else {
          local_100 = local_fc;
        }
        local_f0 = (uint)local_e8[local_100] * local_58[(long)local_5c * 5 + (long)local_f4] +
                   local_f0;
      }
      *(char *)((long)local_8 + (long)local_ec) = (char)(local_f0 + 8 >> 4);
    }
  }
  return;
}

Assistant:

void av1_filter_intra_edge_c(uint8_t *p, int sz, int strength) {
  if (!strength) return;

  const int kernel[INTRA_EDGE_FILT][INTRA_EDGE_TAPS] = { { 0, 4, 8, 4, 0 },
                                                         { 0, 5, 6, 5, 0 },
                                                         { 2, 4, 4, 4, 2 } };
  const int filt = strength - 1;
  uint8_t edge[129];

  memcpy(edge, p, sz * sizeof(*p));
  for (int i = 1; i < sz; i++) {
    int s = 0;
    for (int j = 0; j < INTRA_EDGE_TAPS; j++) {
      int k = i - 2 + j;
      k = (k < 0) ? 0 : k;
      k = (k > sz - 1) ? sz - 1 : k;
      s += edge[k] * kernel[filt][j];
    }
    s = (s + 8) >> 4;
    p[i] = s;
  }
}